

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

void __thiscall QInputDialogPrivate::ensureLineEdit(QInputDialogPrivate *this)

{
  QLineEdit *this_00;
  QWidgetPrivate *pQVar1;
  QInputDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  Object *unaff_retaddr;
  Function in_stack_00000020;
  offset_in_QLineEdit_to_subr in_stack_00000030;
  QInputDialog *q;
  QWidget *in_stack_ffffffffffffffa8;
  ConnectionType in_stack_fffffffffffffff4;
  Object *receiverPrivate;
  
  receiverPrivate = *(Object **)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if (in_RDI->lineEdit == (QLineEdit *)0x0) {
    this_00 = (QLineEdit *)operator_new(0x28);
    QLineEdit::QLineEdit(this_00,in_stack_ffffffffffffffa8);
    in_RDI->lineEdit = this_00;
    pQVar1 = qt_widget_private((QWidget *)0x79ab6e);
    pQVar1->field_0x253 = pQVar1->field_0x253 | 4;
    QWidget::hide((QWidget *)0x79ab91);
    QObjectPrivate::
    connect<void(QLineEdit::*)(QString_const&),void(QInputDialogPrivate::*)(QString_const&)>
              (unaff_retaddr,in_stack_00000030,receiverPrivate,in_stack_00000020,
               in_stack_fffffffffffffff4);
    QMetaObject::Connection::~Connection((Connection *)&stack0xfffffffffffffff0);
  }
  if (*(Object **)(in_FS_OFFSET + 0x28) == receiverPrivate) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::ensureLineEdit()
{
    Q_Q(QInputDialog);
    if (!lineEdit) {
        lineEdit = new QLineEdit(q);
#ifndef QT_NO_IM
        qt_widget_private(lineEdit)->inheritsInputMethodHints = 1;
#endif
        lineEdit->hide();
        QObjectPrivate::connect(lineEdit, &QLineEdit::textChanged,
                                this, &QInputDialogPrivate::textChanged);
    }
}